

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_graph.cpp
# Opt level: O1

void __thiscall indigox::ElectronGraph::ElectronGraph(ElectronGraph *this,MolecularGraph *G)

{
  edge_base<boost::undirected_tag,_void_*> *peVar1;
  Atom *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  mapped_type pvVar2;
  mapped_type pvVar3;
  MolEdge e;
  mapped_type *ppvVar4;
  VertType pvVar5;
  long *plVar6;
  element_type *peVar7;
  MolecularGraph *pMVar8;
  AdjList *g;
  StoredVertexList *pSVar9;
  ElnVertProp e_prop;
  MolVertex v;
  MolVertex u;
  unordered_map<void_*,_void_*,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_void_*>_>_>
  mol2eln;
  ElnVertProp local_e8;
  MolecularGraph *local_c0;
  long local_b8;
  MolecularGraph *local_b0;
  void *local_98;
  void *local_90;
  void *local_88;
  undefined8 uStack_80;
  _List_node_base **local_78;
  undefined1 local_68 [40];
  ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_void_*,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<void_*>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
  *local_40;
  __node_base_ptr p_Stack_38;
  
  utils::Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>::
  Graph(&this->super__ElnGraph);
  local_68._0_8_ = &p_Stack_38;
  local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_68._16_8_ = (_Hash_node_base *)0x0;
  local_68._24_8_ = 0;
  local_68._32_4_ = 1.0;
  local_40 = (ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_void_*,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<void_*>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
              *)0x0;
  p_Stack_38 = (__node_base_ptr)0x0;
  peVar7 = (G->super__MolGraph).graph_.
           super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  plVar6 = *(long **)&(peVar7->super_type).m_vertices.
                      super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node;
  pSVar9 = &(peVar7->super_type).m_vertices;
  local_c0 = G;
  if ((StoredVertexList *)plVar6 != pSVar9) {
    do {
      this_00 = *(Atom **)(plVar6[2] + 0x30);
      this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(plVar6[2] + 0x38);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      local_e8.id.first = (void *)plVar6[2];
      local_e8.id.second = local_e8.id.first;
      Atom::GetElement(this_00);
      local_e8.electronegativity = *(float *)(local_b8 + 0x58);
      if (local_b0 != (MolecularGraph *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0);
      }
      Atom::GetElement(this_00);
      local_e8.valence = *(uint8_t *)(local_b8 + 0x43);
      if (local_b0 != (MolecularGraph *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0);
      }
      Atom::GetElement(this_00);
      local_e8.atomic_number = *(uint8_t *)(local_b8 + 0x42);
      pMVar8 = local_b0;
      if (local_b0 != (MolecularGraph *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0);
      }
      local_e8.electron_count = '\0';
      local_e8.pre_placed = PreplaceCount(pMVar8,(MolVertex)plVar6[2]);
      Atom::GetElement(this_00);
      local_e8.target_octet = *(uint8_t *)(local_b8 + 0x44);
      if (local_b0 != (MolecularGraph *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0);
      }
      Atom::GetElement(this_00);
      local_e8.target_hyper_octet = *(uint8_t *)(local_b8 + 0x45);
      if (local_b0 != (MolecularGraph *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0);
      }
      local_e8.formal_charge = '\0';
      local_b0 = (MolecularGraph *)
                 utils::
                 Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
                 ::AddVertex(&this->super__ElnGraph,&local_e8);
      local_b8 = plVar6[2];
      std::
      _Hashtable<void*,std::pair<void*const,void*>,std::allocator<std::pair<void*const,void*>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<void*,void*>>
                ((_Hashtable<void*,std::pair<void*const,void*>,std::allocator<std::pair<void*const,void*>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_68,&local_b8);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      plVar6 = (long *)*plVar6;
    } while ((StoredVertexList *)plVar6 != pSVar9);
  }
  local_c0 = (MolecularGraph *)
             (local_c0->super__MolGraph).graph_.
             super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  peVar7 = *(element_type **)
            &(((element_type *)local_c0)->super_type).m_edges.
             super__List_base<boost::list_edge<void_*,_indigox::MolEdgeProp>,_std::allocator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>_>
  ;
  if ((MolecularGraph *)peVar7 != local_c0) {
    do {
      local_90 = *(void **)((long)&(peVar7->super_type).m_edges.
                                   super__List_base<boost::list_edge<void_*,_indigox::MolEdgeProp>,_std::allocator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>_>
                           + 0x10);
      local_98 = *(void **)&(peVar7->super_type).m_vertices.
                            super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node;
      pMVar8 = (MolecularGraph *)local_68;
      ppvVar4 = std::__detail::
                _Map_base<void_*,_std::pair<void_*const,_void_*>,_std::allocator<std::pair<void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<void_*,_std::pair<void_*const,_void_*>,_std::allocator<std::pair<void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)pMVar8,&local_90);
      pvVar2 = *ppvVar4;
      ppvVar4 = std::__detail::
                _Map_base<void_*,_std::pair<void_*const,_void_*>,_std::allocator<std::pair<void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<void_*,_std::pair<void_*const,_void_*>,_std::allocator<std::pair<void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)pMVar8,&local_98);
      pvVar3 = *ppvVar4;
      if (local_90 < local_98) {
        local_e8.id.first = local_90;
        local_e8.id.second = local_98;
      }
      else {
        local_e8.id.first = local_98;
        local_e8.id.second = local_90;
      }
      local_e8.electron_count = '\0';
      local_78 = (_List_node_base **)
                 ((long)&(peVar7->super_type).m_vertices.
                         super__List_base<void_*,_std::allocator<void_*>_> + 8);
      peVar1 = (edge_base<boost::undirected_tag,_void_*> *)
               ((long)&(peVar7->super_type).m_edges.
                       super__List_base<boost::list_edge<void_*,_indigox::MolEdgeProp>,_std::allocator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>_>
               + 0x10);
      local_88 = peVar1->m_source;
      uStack_80 = *(undefined8 *)
                   &(peVar7->super_type).m_vertices.
                    super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node;
      e.m_eproperty = local_78;
      e.super_edge_base<boost::undirected_tag,_void_*> = *peVar1;
      local_e8.pre_placed = PreplaceCount(pMVar8,e);
      pvVar5 = utils::
               Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
               ::AddVertex(&this->super__ElnGraph,&local_e8);
      utils::
      Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>::
      AddEdge(&local_b8,&this->super__ElnGraph,pvVar2,pvVar5);
      utils::
      Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>::
      AddEdge(&local_b8,&this->super__ElnGraph,pvVar3,pvVar5);
      peVar7 = *(element_type **)
                &(peVar7->super_type).m_edges.
                 super__List_base<boost::list_edge<void_*,_indigox::MolEdgeProp>,_std::allocator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>_>
      ;
    } while ((MolecularGraph *)peVar7 != local_c0);
  }
  std::
  _Hashtable<void_*,_std::pair<void_*const,_void_*>,_std::allocator<std::pair<void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<void_*,_std::pair<void_*const,_void_*>,_std::allocator<std::pair<void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_68);
  return;
}

Assistant:

ElectronGraph::ElectronGraph(const MolecularGraph &G)
  : _ElnGraph()
  {
    using namespace std;
    unordered_map<MolVertex, ElnVertex> mol2eln;
    MolVertIterPair vertices = G.GetVertices();
    uint16_t count = 0;
    for (MolVertexIter b = vertices.first; b != vertices.second; ++b) {
      MolVertProp prop = *G.GetProperties(*b);
      ElnVertProp e_prop;
      e_prop.id = make_pair(*b, *b);
      count++;
      e_prop.electronegativity = prop.atom->GetElement()->GetElectronegativity();
      e_prop.valence = prop.atom->GetElement()->GetValenceElectronCount();
      e_prop.atomic_number = prop.atom->GetElement()->GetAtomicNumber();
      e_prop.electron_count = 0;
      e_prop.pre_placed = PreplaceCount(G, *b);
      e_prop.target_octet = prop.atom->GetElement()->GetOctet();
      e_prop.target_hyper_octet = prop.atom->GetElement()->GetHypervalentOctet();
      e_prop.formal_charge = 0;
      
      
      ElnVertex e_vert = AddVertex(e_prop);
      mol2eln.insert(make_pair(*b, e_vert));
    }
    
    MolEdgeIterPair edges = G.GetEdges();
    for (MolEdgeIter b = edges.first; b != edges.second; ++b) {
      MolVertex u = G.GetSource(*b), v = G.GetTarget(*b);
      ElnVertex u_eln = mol2eln.at(u), v_eln = mol2eln.at(v);
      ElnVertProp e_prop;
      if (u < v)
        e_prop.id = make_pair(u, v);
      else
        e_prop.id = make_pair(v, u);
      e_prop.electron_count = 0;
      e_prop.pre_placed = PreplaceCount(G, *b);
      ElnVertex e_vert = AddVertex(e_prop);
      AddEdge(u_eln, e_vert);
      AddEdge(v_eln, e_vert);
    }
  }